

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int IoCommandReadAiger(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fCheck;
  
  Extra_UtilGetoptReset();
  fCheck = 1;
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"ch");
    if (iVar1 != 99) break;
    fCheck = fCheck ^ 1;
  }
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    iVar1 = 1;
    pNtk = Io_Read(argv[globalUtilOptind],IO_FILE_AIGER,fCheck,0);
    if (pNtk != (Abc_Ntk_t *)0x0) {
      Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
      Abc_FrameClearVerifStatus(pAbc);
      iVar1 = 0;
    }
  }
  else {
    fwrite("usage: read_aiger [-ch] <file>\n",0x1f,1,(FILE *)pAbc->Err);
    fwrite("\t         reads the network in the AIGER format (http://fmv.jku.at/aiger)\n",0x4a,1,
           (FILE *)pAbc->Err);
    pcVar2 = "yes";
    if (fCheck == 0) {
      pcVar2 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",
            pcVar2);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int IoCommandReadAiger( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int fCheck;
    int c;

    fCheck = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
            case 'c':
                fCheck ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    pNtk = Io_Read( pFileName, IO_FILE_AIGER, fCheck, 0 );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_aiger [-ch] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in the AIGER format (http://fmv.jku.at/aiger)\n" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}